

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::object_projection::evaluate
          (object_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  pointer ppeVar1;
  bool bVar2;
  int iVar3;
  pointer ptr;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_00;
  undefined4 extraout_var;
  reference pbVar5;
  value_type *pvVar6;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  **expression;
  pointer ppeVar7;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *item;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  _Var8;
  value_type *local_58;
  const_object_range_type local_50;
  value_type *pvVar4;
  
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object(val)
  ;
  if (!bVar2) {
    pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ::null_value(context);
    return pbVar5;
  }
  this_00 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
            eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
            ::create_json<jsoncons::json_array_arg_t_const&>
                      ((eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                        *)context,(json_array_arg_t *)&json_array_arg);
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
            (&local_50,
             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)val);
  _Var8._M_current = local_50.first_.it_._M_current;
  bVar2 = local_50.first_.has_value_ == local_50.last_.has_value_;
  if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) != 0) {
    bVar2 = local_50.first_.it_._M_current == local_50.last_.it_._M_current;
  }
  while (!bVar2) {
    pvVar4 = &(_Var8._M_current)->value_;
    pvVar6 = pvVar4;
    while ((*(byte *)&pvVar6->field_0 & 0xf) - 8 < 2) {
      pvVar6 = *(value_type **)((long)&(pvVar6->field_0).int64_ + 8);
    }
    if ((*(byte *)&pvVar6->field_0 & 0xf) != 0) {
      ppeVar1 = (this->super_projection_base).expressions_.
                super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppeVar7 = (this->super_projection_base).expressions_.
                     super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar6 = pvVar4, ppeVar7 != ppeVar1;
          ppeVar7 = ppeVar7 + 1) {
        iVar3 = (*((*ppeVar7)->
                  super_expr_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  )._vptr_expr_base[2])(*ppeVar7,pvVar4,context,ec);
        pvVar4 = (value_type *)CONCAT44(extraout_var,iVar3);
      }
      while ((*(byte *)&pvVar6->field_0 & 0xf) - 8 < 2) {
        pvVar6 = *(value_type **)((long)&(pvVar6->field_0).int64_ + 8);
      }
      if ((*(byte *)&pvVar6->field_0 & 0xf) != 0) {
        local_58 = pvVar4;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const*>
                  (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_58);
      }
    }
    _Var8._M_current = _Var8._M_current + 1;
    bVar2 = _Var8._M_current == local_50.last_.it_._M_current;
    if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) == 0) {
      bVar2 = local_50.first_.has_value_ == local_50.last_.has_value_;
    }
  }
  return (reference)this_00;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_object())
                {
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                for (auto& item : val.object_range())
                {
                    if (!item.value().is_null())
                    {
                        reference j = this->apply_expressions(item.value(), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }
                return *result;
            }